

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O0

void __thiscall glauber::Output::Output(Output *this,VarMap *var_map)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  bool *pbVar4;
  size_type sVar5;
  path *ppVar6;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  path *in_RDI;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  path *output_path;
  int width;
  int nevents;
  string *in_stack_fffffffffffffde8;
  variables_map *in_stack_fffffffffffffdf0;
  anon_class_40_2_a59befe2 *in_stack_fffffffffffffdf8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffe00;
  allocator *__lhs_00;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  path *local_a8;
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  undefined1 extraout_var [56];
  
  local_10 = in_RSI;
  std::
  vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
  ::vector((vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
            *)0x180627);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"number-events",&local_39);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  piVar3 = boost::program_options::variable_value::as<int>((variable_value *)0x180696);
  iVar1 = *piVar3;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = iVar1;
  auVar7._0_8_ = (path *)std::log10<int>(0);
  auVar7._8_56_ = extraout_var;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar7._0_8_;
  auVar8 = vroundsd_avx(auVar7._0_16_,auVar8,10);
  local_50 = (int)auVar8._0_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"quiet",&local_71);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  pbVar4 = boost::program_options::variable_value::as<bool>((variable_value *)0x180779);
  bVar2 = *pbVar4;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    local_78 = local_50;
    std::
    vector<std::function<void(int,double,glauber::Event_const&)>,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
    ::emplace_back<glauber::Output::Output(boost::program_options::variables_map_const&)::__0>
              ((vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                *)in_stack_fffffffffffffe00,(anon_class_4_1_a8d81ce6 *)in_stack_fffffffffffffdf8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"output",&local_99);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (sVar5 != 0) {
    __lhs_00 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"output",__lhs_00);
    boost::program_options::variables_map::operator[]
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    ppVar6 = boost::program_options::variable_value::as<boost::filesystem::path>
                       ((variable_value *)0x180966);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_a8 = ppVar6;
    bVar2 = anon_unknown_2::is_hdf5(auVar7._0_8_);
    if (bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"HDF5 output was not compiled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = boost::filesystem::exists((path *)in_stack_fffffffffffffdf0);
    if (bVar2) {
      bVar2 = boost::filesystem::is_empty((path *)0x180ad6);
      if (!bVar2) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        boost::filesystem::path::string_abi_cxx11_(local_a8);
        std::operator+((char *)__lhs_00,local_10);
        std::operator+(__lhs,(char *)in_stack_fffffffffffffdf0);
        std::runtime_error::runtime_error((runtime_error *)__lhs,local_f0);
        __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      boost::filesystem::create_directories((path *)0x180c0b);
    }
    boost::filesystem::path::path(in_RDI,(path *)in_stack_fffffffffffffde8);
    std::
    vector<std::function<void(int,double,glauber::Event_const&)>,std::allocator<std::function<void(int,double,glauber::Event_const&)>>>
    ::emplace_back<glauber::Output::Output(boost::program_options::variables_map_const&)::__1>
              ((vector<std::function<void_(int,_double,_const_glauber::Event_&)>,_std::allocator<std::function<void_(int,_double,_const_glauber::Event_&)>_>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    Output(boost::program_options::variables_map_const&)::$_1::~__1
              ((anon_class_40_2_a59befe2 *)0x180c62);
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, const Event& event) {
        write_stream(std::cout, width, num, impact_param, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (is_hdf5(output_path)) {
#ifdef GLAUBER_HDF5
      if (fs::exists(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // GLAUBER_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      writers_.emplace_back(
        [output_path, width](int num, double impact_param, const Event& event) {
          write_text_file(output_path, width, num, impact_param, event);
        }
      );
    }
  }
}